

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void map_object(obj *obj,int show)

{
  byte bVar1;
  boolean bVar2;
  int x_00;
  int y_00;
  bool bVar3;
  bool local_41;
  int local_40;
  undefined8 local_3c;
  rm tmp_loc;
  rm *loc;
  int monnum;
  int objtyp;
  int y;
  int x;
  int show_local;
  obj *obj_local;
  
  x_00 = (int)obj->ox;
  y_00 = (int)obj->oy;
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
    local_40 = (int)obj->otyp;
  }
  else {
    local_40 = display_rng(0x219);
    local_40 = local_40 + 1;
  }
  loc._4_4_ = 0;
  tmp_loc._4_8_ = level->locations[x_00] + y_00;
  if ((*(uint *)&(level->flags).field_0x8 >> 0xe & 1) == 0) {
    local_3c = *(undefined8 *)tmp_loc._4_8_;
    tmp_loc._0_4_ = *(undefined4 *)&((rm *)tmp_loc._4_8_)->field_0x8;
    tmp_loc._4_8_ = &local_3c;
  }
  if (((local_40 == 0x10e) || (local_40 == 0x215)) || (local_40 == 0xf6)) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      loc._4_4_ = obfuscate_monster(obj->corpsenm);
    }
    else {
      loc._4_4_ = display_rng(0x193);
    }
  }
  *(uint *)tmp_loc._4_8_ = *(uint *)tmp_loc._4_8_ & 0xffe007ff | (local_40 + 1U & 0x3ff) << 0xb;
  *(uint *)tmp_loc._4_8_ = *(uint *)tmp_loc._4_8_ & 0xc01fffff | (loc._4_4_ + 1U & 0x1ff) << 0x15;
  local_41 = false;
  if ((obj->otyp != 0x214) && (local_41 = false, level->objects[x_00][y_00] != (obj *)0x0)) {
    local_41 = (level->objects[x_00][y_00]->v).v_nexthere != (obj *)0x0;
  }
  *(uint *)tmp_loc._4_8_ = *(uint *)tmp_loc._4_8_ & 0xbfffffff | (uint)local_41 << 0x1e;
  bVar1 = 0;
  if ((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0) {
    bVar3 = true;
    if ((obj->otyp != 0xda) && (bVar3 = true, obj->otyp != 0xdb)) {
      bVar3 = obj->otyp == 0xdc;
    }
    bVar1 = bVar3 ^ 1;
  }
  *(uint *)tmp_loc._4_8_ = *(uint *)tmp_loc._4_8_ & 0x7fffffff | (uint)bVar1 << 0x1f;
  if (show != 0) {
    dbuf_set(level,x_00,y_00,(rm *)tmp_loc._4_8_,-1,-1,-1,-1,-1,-1,0,0,0,0);
  }
  return;
}

Assistant:

void map_object(struct obj *obj, int show)
{
    int x = obj->ox, y = obj->oy;
    int objtyp = what_obj(obj->otyp);
    int monnum = 0;
    struct rm *loc = &level->locations[x][y];
    struct rm tmp_loc;

    if (!level->flags.hero_memory) {
	tmp_loc = *loc;
	loc = &tmp_loc;
    }

    if (objtyp == CORPSE || objtyp == STATUE || objtyp == FIGURINE) {
	if (Hallucination)
	    monnum = random_monster();
	else
	    monnum = obfuscate_monster(obj->corpsenm);
    }
    loc->mem_obj = objtyp + 1;
    loc->mem_obj_mn = monnum + 1;
    loc->mem_obj_stacks = obj->otyp != BOULDER &&
			  level->objects[x][y] && level->objects[x][y]->nexthere;
    loc->mem_obj_prize = Is_prize(obj);

    if (show)
	dbuf_set(level, x, y, loc, -1, -1, -1, -1, -1, -1, 0, 0, 0, 0);
}